

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O1

string * __thiscall
WavParserHelper::GetAudioFormatTag_abi_cxx11_
          (string *__return_storage_ptr__,WavParserHelper *this,unsigned_short wFormatTag)

{
  char *pcVar1;
  uint uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (int)this + 2;
  if ((ushort)uVar2 < 10) {
    pcVar1 = &DAT_0010bc78 + *(int *)(&DAT_0010bc78 + (ulong)(uVar2 & 0xffff) * 4);
  }
  else {
    pcVar1 = "WAVE_FORMAT_UNKNOWN";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string WavParserHelper::GetAudioFormatTag(unsigned short wFormatTag)
{
	std::string FormatTag;
	switch (wFormatTag)
	{
	case 0x0000:
		FormatTag = "WAVE_FORMAT_UNKNOWN";
		break;
	case 0x0001:
		FormatTag = "WAVE_FORMAT_PCM";
		break;
	case 0x0002:
		FormatTag = "WAVE_FORMAT_ADPCM";
		break;
	case 0x0003:
		FormatTag = "WAVE_FORMAT_IEEE_FLOAT";
		break;
	case 0x0006:
		FormatTag = "WAVE_FORMAT_ALAW";
		break;
	case 0x0007:
		FormatTag = "WAVE_FORMAT_MULAW";
		break;
	case 0xFFFE:
		FormatTag = "WAVE_FORMAT_EXTENSIBLE";
		break;
	case 0xFFFF:
		FormatTag = "WAVE_FORMAT_DEVELOPMENT";
		break;
	default:
		FormatTag = "WAVE_FORMAT_UNKNOWN";
	}

	return FormatTag;
}